

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O3

matrix<trng::GF2,_4UL> *
trng::operator*(matrix<trng::GF2,_4UL> *__return_storage_ptr__,matrix<trng::GF2,_4UL> *a,
               matrix<trng::GF2,_4UL> *b)

{
  pointer pGVar1;
  pointer pGVar2;
  pointer pGVar3;
  long lVar4;
  pointer pGVar5;
  size_type j;
  long lVar6;
  size_type k;
  long lVar7;
  GF2 sum;
  byte bVar8;
  
  pGVar2 = (pointer)operator_new(0x10);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_start = pGVar2;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pGVar2 + 0x10;
  *(undefined8 *)pGVar2 = 0;
  *(undefined8 *)(pGVar2 + 8) = 0;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_finish = pGVar2 + 0x10;
  pGVar3 = (a->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar1 = (b->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)pGVar2 = 0;
  *(undefined8 *)(pGVar2 + 8) = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    pGVar5 = pGVar1;
    do {
      lVar7 = 0;
      bVar8 = 0;
      do {
        bVar8 = bVar8 ^ pGVar5[lVar7 * 4].value & pGVar3[lVar7].value;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      pGVar2[lVar6 + lVar4 * 4].value = pGVar2[lVar6 + lVar4 * 4].value ^ bVar8;
      lVar6 = lVar6 + 1;
      pGVar5 = pGVar5 + 1;
    } while (lVar6 != 4);
    lVar4 = lVar4 + 1;
    pGVar3 = pGVar3 + 4;
  } while (lVar4 != 4);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }